

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_highbd_quantize_sse4.c
# Opt level: O0

void quantize_coeff_phase2
               (__m128i *qcoeff,__m128i *dquan,__m128i *sign,__m128i *param,int shift,int scale,
               tran_low_t *qAddr,tran_low_t *dqAddr)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  ulong uVar4;
  longlong lVar5;
  longlong lVar6;
  __m128i alVar7;
  __m128i mask0H;
  __m128i mask0L;
  uint uStack_60;
  uint uStack_5c;
  int scale_local;
  int shift_local;
  __m128i *param_local;
  __m128i *sign_local;
  __m128i *dquan_local;
  __m128i *qcoeff_local;
  
  alVar7 = (__m128i)pmuldq((undefined1  [16])qcoeff[1],(undefined1  [16])param[1]);
  qcoeff[1] = alVar7;
  uVar3 = qcoeff[1][1];
  qcoeff[1][0] = (ulong)qcoeff[1][0] >> (ulong)(uint)shift;
  qcoeff[1][1] = uVar3 >> (ulong)(uint)shift;
  alVar7 = (__m128i)pmuldq((undefined1  [16])qcoeff[1],(undefined1  [16])param[2]);
  dquan[1] = alVar7;
  uVar3 = dquan[1][1];
  dquan[1][0] = (ulong)dquan[1][0] >> (ulong)(uint)scale;
  dquan[1][1] = uVar3 >> (ulong)(uint)scale;
  uVar1 = *(undefined4 *)((long)*qcoeff + 4);
  lVar5 = (*qcoeff)[1];
  uVar2 = *(undefined4 *)((long)*qcoeff + 0xc);
  *(int *)*qcoeff = (int)(*qcoeff)[0];
  *(int *)((long)*qcoeff + 4) = (int)lVar5;
  *(undefined4 *)(*qcoeff + 1) = uVar1;
  *(undefined4 *)((long)*qcoeff + 0xc) = uVar2;
  lVar5 = qcoeff[1][0];
  lVar6 = qcoeff[1][1];
  uVar1 = *(undefined4 *)((long)qcoeff[1] + 0xc);
  *(undefined4 *)qcoeff[1] = *(undefined4 *)((long)qcoeff[1] + 4);
  *(undefined4 *)((long)qcoeff[1] + 4) = uVar1;
  *(int *)(qcoeff[1] + 1) = (int)lVar5;
  *(int *)((long)qcoeff[1] + 0xc) = (int)lVar6;
  (*qcoeff)[0] = (*qcoeff)[0];
  (*qcoeff)[1] = 0;
  lVar5 = qcoeff[1][1];
  qcoeff[1][0] = 0;
  qcoeff[1][1] = lVar5;
  uVar1 = *(undefined4 *)((long)*dquan + 4);
  lVar5 = (*dquan)[1];
  uVar2 = *(undefined4 *)((long)*dquan + 0xc);
  *(int *)*dquan = (int)(*dquan)[0];
  *(int *)((long)*dquan + 4) = (int)lVar5;
  *(undefined4 *)(*dquan + 1) = uVar1;
  *(undefined4 *)((long)*dquan + 0xc) = uVar2;
  lVar5 = dquan[1][0];
  lVar6 = dquan[1][1];
  uVar1 = *(undefined4 *)((long)dquan[1] + 0xc);
  *(undefined4 *)dquan[1] = *(undefined4 *)((long)dquan[1] + 4);
  *(undefined4 *)((long)dquan[1] + 4) = uVar1;
  *(int *)(dquan[1] + 1) = (int)lVar5;
  *(int *)((long)dquan[1] + 0xc) = (int)lVar6;
  (*dquan)[0] = (*dquan)[0];
  (*dquan)[1] = 0;
  lVar5 = dquan[1][1];
  dquan[1][0] = 0;
  dquan[1][1] = lVar5;
  uVar3 = (*qcoeff)[1];
  uVar4 = qcoeff[1][1];
  (*qcoeff)[0] = (*qcoeff)[0] | qcoeff[1][0];
  (*qcoeff)[1] = uVar3 | uVar4;
  uVar3 = (*dquan)[1];
  uVar4 = dquan[1][1];
  (*dquan)[0] = (*dquan)[0] | dquan[1][0];
  (*dquan)[1] = uVar3 | uVar4;
  alVar7 = (__m128i)psignd((undefined1  [16])*qcoeff,(undefined1  [16])*sign);
  *qcoeff = alVar7;
  alVar7 = (__m128i)psignd((undefined1  [16])*dquan,(undefined1  [16])*sign);
  *dquan = alVar7;
  uVar3 = (*qcoeff)[1];
  uVar4 = qcoeff[2][1];
  (*qcoeff)[0] = ~qcoeff[2][0] & (*qcoeff)[0];
  (*qcoeff)[1] = ~uVar4 & uVar3;
  mask0L[1]._0_4_ = (uint)qcoeff[2][0];
  mask0L[1]._4_4_ = (uint)((ulong)qcoeff[2][0] >> 0x20);
  uStack_60 = (uint)qcoeff[2][1];
  uStack_5c = (uint)((ulong)qcoeff[2][1] >> 0x20);
  mask0H[1]._0_4_ = (uint)(*dquan)[0];
  mask0H[1]._4_4_ = (uint)((ulong)(*dquan)[0] >> 0x20);
  mask0L[0]._0_4_ = (uint)(*dquan)[1];
  mask0L[0]._4_4_ = (uint)((ulong)(*dquan)[1] >> 0x20);
  *(uint *)*dquan = ((uint)mask0L[1] ^ 0xffffffff) & (uint)mask0H[1];
  *(uint *)((long)*dquan + 4) = (mask0L[1]._4_4_ ^ 0xffffffff) & mask0H[1]._4_4_;
  *(uint *)(*dquan + 1) = (uStack_60 ^ 0xffffffff) & (uint)mask0L[0];
  *(uint *)((long)*dquan + 0xc) = (uStack_5c ^ 0xffffffff) & mask0L[0]._4_4_;
  lVar5 = (*qcoeff)[1];
  *(longlong *)qAddr = (*qcoeff)[0];
  *(longlong *)(qAddr + 2) = lVar5;
  lVar5 = (*dquan)[1];
  *(longlong *)dqAddr = (*dquan)[0];
  *(longlong *)(dqAddr + 2) = lVar5;
  return;
}

Assistant:

static inline void quantize_coeff_phase2(__m128i *qcoeff, __m128i *dquan,
                                         const __m128i *sign,
                                         const __m128i *param, const int shift,
                                         const int scale, tran_low_t *qAddr,
                                         tran_low_t *dqAddr) {
  __m128i mask0L = _mm_set_epi32(-1, -1, 0, 0);
  __m128i mask0H = _mm_set_epi32(0, 0, -1, -1);

  qcoeff[1] = _mm_mul_epi32(qcoeff[1], param[1]);
  qcoeff[1] = _mm_srli_epi64(qcoeff[1], shift);
  dquan[1] = _mm_mul_epi32(qcoeff[1], param[2]);
  dquan[1] = _mm_srli_epi64(dquan[1], scale);

  // combine L&H
  qcoeff[0] = _mm_shuffle_epi32(qcoeff[0], 0xd8);
  qcoeff[1] = _mm_shuffle_epi32(qcoeff[1], 0x8d);

  qcoeff[0] = _mm_and_si128(qcoeff[0], mask0H);
  qcoeff[1] = _mm_and_si128(qcoeff[1], mask0L);

  dquan[0] = _mm_shuffle_epi32(dquan[0], 0xd8);
  dquan[1] = _mm_shuffle_epi32(dquan[1], 0x8d);

  dquan[0] = _mm_and_si128(dquan[0], mask0H);
  dquan[1] = _mm_and_si128(dquan[1], mask0L);

  qcoeff[0] = _mm_or_si128(qcoeff[0], qcoeff[1]);
  dquan[0] = _mm_or_si128(dquan[0], dquan[1]);

  qcoeff[0] = _mm_sign_epi32(qcoeff[0], *sign);
  dquan[0] = _mm_sign_epi32(dquan[0], *sign);
  qcoeff[0] = _mm_andnot_si128(qcoeff[2], qcoeff[0]);
  dquan[0] = _mm_andnot_si128(qcoeff[2], dquan[0]);
  _mm_storeu_si128((__m128i *)qAddr, qcoeff[0]);
  _mm_storeu_si128((__m128i *)dqAddr, dquan[0]);
}